

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O0

int gdImageGetPixel(gdImagePtr im,int x,int y)

{
  int y_local;
  int x_local;
  gdImagePtr im_local;
  
  if ((((y < im->cy1) || (im->cy2 < y)) || (x < im->cx1)) || (im->cx2 < x)) {
    im_local._4_4_ = 0;
  }
  else if (im->trueColor == 0) {
    im_local._4_4_ = (uint)im->pixels[y][x];
  }
  else {
    im_local._4_4_ = im->tpixels[y][x];
  }
  return im_local._4_4_;
}

Assistant:

BGD_DECLARE(int) gdImageGetPixel (gdImagePtr im, int x, int y)
{
	if (gdImageBoundsSafeMacro (im, x, y)) {
		if (im->trueColor) {
			return im->tpixels[y][x];
		} else {
			return im->pixels[y][x];
		}
	} else {
		return 0;
	}
}